

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_test_flags_&> * __thiscall
Catch::ExprLhs<type_safe::flag_set<test_flags>const&>::operator==
          (BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_test_flags_&>
           *__return_storage_ptr__,ExprLhs<type_safe::flag_set<test_flags>const&> *this,
          test_flags *rhs)

{
  int_type iVar1;
  flag_set<test_flags> *pfVar2;
  test_flags tVar3;
  StringRef local_40;
  
  pfVar2 = *(flag_set<test_flags> **)this;
  iVar1 = (pfVar2->flags_).bits_;
  tVar3 = *rhs;
  StringRef::StringRef(&local_40,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result =
       iVar1 == (int_type)(1 << ((char)tVar3 & 0x1f));
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0021db50;
  __return_storage_ptr__->m_lhs = pfVar2;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }